

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

void __thiscall MIDIStreamer::Precache(MIDIStreamer *this)

{
  int iVar1;
  undefined4 extraout_var;
  DWORD (*paDVar2) [384];
  uint uVar3;
  int j;
  undefined4 uVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  int i;
  ulong uVar8;
  uint uVar9;
  TArray<unsigned_short,_unsigned_short> packed;
  BYTE found_banks [256];
  BYTE found_instruments [256];
  TArray<unsigned_short,_unsigned_short> local_258;
  DWORD (*local_248) [384];
  MIDIStreamer *local_240;
  char local_238 [128];
  undefined1 local_1b8;
  char local_138 [264];
  
  uVar4 = 0;
  memset(local_138,0,0x100);
  memset(local_238,0,0x100);
  this->LoopLimit = 1;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  local_238[0] = '\x01';
  local_1b8 = 1;
  iVar1 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
  if ((char)iVar1 == '\0') {
    local_248 = this->Events + 1;
    uVar4 = 0;
    do {
      iVar1 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])(this,this->Events,local_248,600000000);
      for (paDVar2 = this->Events; paDVar2 < (undefined1 *)CONCAT44(extraout_var,iVar1);
          paDVar2 = (DWORD (*) [384])((long)*paDVar2 + lVar6)) {
        uVar9 = (*paDVar2)[2];
        if (uVar9 < 0x1000000) {
          uVar3 = uVar9 >> 8 & 0x7f;
          pcVar5 = local_138;
          if ((uVar9 & 0xf) == 9 || (uVar9 & 0x70) != 0x40) {
            if (uVar3 == 0 || (uVar9 & 0x7f) != 0x49) {
              uVar7 = uVar9 >> 0x10 & 0x7f;
              if (uVar7 != 0 && (uVar9 & 0x7f) == 0x19) {
                uVar3 = uVar3 | 0x80;
                goto LAB_0033c104;
              }
              if (((uVar7 == 0) || ((uVar9 & 0x70) != 0x30)) || (uVar3 != 0)) goto LAB_0033c10a;
              uVar3 = uVar7;
              if ((uVar9 & 0xf) == 9) {
                uVar3 = uVar9 >> 0x10 | 0x80;
              }
            }
            else {
              uVar3 = uVar3 | 0x80;
            }
            uVar4 = 1;
            pcVar5 = local_238;
          }
LAB_0033c104:
          pcVar5[uVar3] = '\x01';
        }
LAB_0033c10a:
        lVar6 = (ulong)(((*paDVar2)[2] & 0xffffff) + 3 & 0xfffffffc) + 0xc;
        if (-1 < (int)(*paDVar2)[2]) {
          lVar6 = 0xc;
        }
      }
      iVar1 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
    } while ((char)iVar1 == '\0');
  }
  local_248 = (DWORD (*) [384])CONCAT44(local_248._4_4_,uVar4);
  local_240 = this;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  local_258.Array = (unsigned_short *)0x0;
  local_258.Most = 0;
  local_258.Count = 0;
  uVar9 = 0;
  uVar8 = 0;
  do {
    if (local_138[uVar8] != '\0') {
      if (((ulong)local_248 & 1) == 0) {
        TArray<unsigned_short,_unsigned_short>::Grow(&local_258,1);
        local_258.Array[local_258.Count] =
             (ushort)(((uint)uVar8 & 0x80) << 7) | (ushort)uVar8 & 0x7f;
        local_258.Count = local_258.Count + 1;
      }
      else {
        uVar3 = (uint)uVar8 & 0x7f | uVar9 & 0xffffc000;
        lVar6 = 0;
        do {
          if (local_238[lVar6 + (uVar8 & 0xffffffffffffff80)] != '\0') {
            TArray<unsigned_short,_unsigned_short>::Grow(&local_258,1);
            local_258.Array[local_258.Count] = (unsigned_short)uVar3;
            local_258.Count = local_258.Count + 1;
          }
          lVar6 = lVar6 + 1;
          uVar3 = uVar3 + 0x80;
        } while (lVar6 != 0x80);
      }
    }
    uVar8 = uVar8 + 1;
    uVar9 = uVar9 + 0x80;
  } while (uVar8 != 0x100);
  (*local_240->MIDI->_vptr_MIDIDevice[0x11])(local_240->MIDI,local_258.Array,(ulong)local_258.Count)
  ;
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_258);
  return;
}

Assistant:

void MIDIStreamer::Precache()
{
	BYTE found_instruments[256] = { 0, };
	BYTE found_banks[256] = { 0, };
	bool multiple_banks = false;

	LoopLimit = 1;
	DoRestart();
	found_banks[0] = true;		// Bank 0 is always used.
	found_banks[128] = true;

	// Simulate playback to pick out used instruments.
	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				int command = (event[2] & 0x70);
				int channel = (event[2] & 0x0f);
				int data1 = (event[2] >> 8) & 0x7f;
				int data2 = (event[2] >> 16) & 0x7f;

				if (channel != 9 && command == (MIDI_PRGMCHANGE & 0x70))
				{
					found_instruments[data1] = true;
				}
				else if (channel == 9 && command == (MIDI_PRGMCHANGE & 0x70) && data1 != 0)
				{ // On a percussion channel, program change also serves as bank select.
					multiple_banks = true;
					found_banks[data1 | 128] = true;
				}
				else if (channel == 9 && command == (MIDI_NOTEON & 0x70) && data2 != 0)
				{
					found_instruments[data1 | 128] = true;
				}
				else if (command == (MIDI_CTRLCHANGE & 0x70) && data1 == 0 && data2 != 0)
				{
					multiple_banks = true;
					if (channel == 9)
					{
						found_banks[data2 | 128] = true;
					}
					else
					{
						found_banks[data2] = true;
					}
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}
	DoRestart();

	// Now pack everything into a contiguous region for the PrecacheInstruments call().
	TArray<WORD> packed;

	for (int i = 0; i < 256; ++i)
	{
		if (found_instruments[i])
		{
			WORD packnum = (i & 127) | ((i & 128) << 7);
			if (!multiple_banks)
			{
				packed.Push(packnum);
			}
			else
			{ // In order to avoid having to multiplex tracks in a type 1 file,
			  // precache every used instrument in every used bank, even if not
			  // all combinations are actually used.
				for (int j = 0; j < 128; ++j)
				{
					if (found_banks[j + (i & 128)])
					{
						packed.Push(packnum | (j << 7));
					}
				}
			}
		}
	}
	MIDI->PrecacheInstruments(&packed[0], packed.Size());
}